

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O2

void __thiscall
CcsTest_DomainBuilderNestedSelect_Test::~CcsTest_DomainBuilderNestedSelect_Test
          (CcsTest_DomainBuilderNestedSelect_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CcsTest, DomainBuilderNestedSelect) {
  CcsDomain ccs;
  ccs.ruleBuilder()
      .set("a", "base")
      .select("a", v("b"))
        .select("c", v("d"))
          .set("a", "123");
  CcsContext ctx = ccs.build();
  EXPECT_EQ("base", ctx.getString("a"));
  EXPECT_EQ("base", ctx.constrain("a", v("b")).getString("a"));
  EXPECT_EQ("base", ctx.constrain("c", v("d")).getString("a"));
  EXPECT_EQ("123", ctx.constrain("a", v("b")).constrain("c", v("d"))
          .getString("a"));
}